

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::AttachedPart::AttachedPart(AttachedPart *this)

{
  AttachedPart *this_local;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AttachedPart_003307e8;
  this->m_ui8DetachedIndicator = '\0';
  this->m_ui16PartAttachedToID = 0;
  this->m_ui32APPT = 0;
  EntityType::EntityType(&this->m_AttachedPartType);
  (this->super_VariableParameter).m_ui8VarParamType = '\x01';
  return;
}

Assistant:

AttachedPart::AttachedPart() :
    m_ui8DetachedIndicator( 0 ),
    m_ui16PartAttachedToID( 0 ),
    m_ui32APPT( 0 )
{
    m_ui8VarParamType = AttachedPartType;
}